

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::Session::run(Session *this)

{
  int iVar1;
  Config *config;
  size_t sVar2;
  Option<unsigned_long> listed;
  Totals local_48;
  
  iVar1 = 0;
  if ((this->m_configData).showHelp == false) {
    Session::config(this);
    seedRng((IConfig *)(this->m_config).m_p);
    if ((this->m_configData).filenamesAsTags == true) {
      applyFilenamesAsTags((IConfig *)(this->m_config).m_p);
    }
    config = Session::config(this);
    local_48.assertions.passed = 0;
    if ((config->m_data).listTests == true) {
      local_48.assertions.failedButOk = listTests(config);
      local_48.assertions.passed = (size_t)&local_48.assertions.failedButOk;
    }
    if ((config->m_data).listTestNamesOnly == true) {
      if ((size_t *)local_48.assertions.passed == (size_t *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = *(size_t *)local_48.assertions.passed;
      }
      local_48.assertions.failedButOk = listTestsNamesOnly(config);
      local_48.assertions.failedButOk = local_48.assertions.failedButOk + sVar2;
      local_48.assertions.passed = (size_t)&local_48.assertions.failedButOk;
    }
    if ((config->m_data).listTags == true) {
      if ((size_t *)local_48.assertions.passed == (size_t *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = *(size_t *)local_48.assertions.passed;
      }
      local_48.assertions.failedButOk = listTags(config);
      local_48.assertions.failedButOk = local_48.assertions.failedButOk + sVar2;
      local_48.assertions.passed = (size_t)&local_48.assertions.failedButOk;
    }
    if ((config->m_data).listReporters == true) {
      if ((size_t *)local_48.assertions.passed == (size_t *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = *(size_t *)local_48.assertions.passed;
      }
      local_48.assertions.failedButOk = listReporters(config);
      local_48.assertions.failedButOk = local_48.assertions.failedButOk + sVar2;
      local_48.assertions.passed = (size_t)&local_48.assertions.failedButOk;
    }
    if ((size_t *)local_48.assertions.passed == (size_t *)0x0) {
      runTests(&local_48,&this->m_config);
      iVar1 = (int)local_48.assertions.failed;
    }
    else {
      iVar1 = *(int *)local_48.assertions.passed;
    }
  }
  return iVar1;
}

Assistant:

int run() {
            if( m_configData.showHelp )
                return 0;

            try
            {
                config(); // Force config to be constructed

                seedRng( *m_config );

                if( m_configData.filenamesAsTags )
                    applyFilenamesAsTags( *m_config );

                // Handle list request
                if( Option<std::size_t> listed = list( config() ) )
                    return static_cast<int>( *listed );

                return static_cast<int>( runTests( m_config ).assertions.failed );
            }
            catch( std::exception& ex ) {
                Catch::cerr() << ex.what() << std::endl;
                return (std::numeric_limits<int>::max)();
            }
        }